

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3ReadEndBlockField(sqlite3_stmt *pStmt,int iCol,i64 *piEndBlock,i64 *pnByte)

{
  bool bVar1;
  uchar *puVar2;
  long local_40;
  i64 iVal;
  int iMul;
  int i;
  uchar *zText;
  i64 *pnByte_local;
  i64 *piEndBlock_local;
  int iCol_local;
  sqlite3_stmt *pStmt_local;
  
  puVar2 = sqlite3_column_text(pStmt,iCol);
  if (puVar2 != (uchar *)0x0) {
    iVal._0_4_ = 1;
    local_40 = 0;
    iVal._4_4_ = 0;
    while( true ) {
      bVar1 = false;
      if (0x2f < puVar2[iVal._4_4_]) {
        bVar1 = puVar2[iVal._4_4_] < 0x3a;
      }
      if (!bVar1) break;
      local_40 = local_40 * 10 + (long)(int)(puVar2[iVal._4_4_] - 0x30);
      iVal._4_4_ = iVal._4_4_ + 1;
    }
    *piEndBlock = local_40;
    for (; puVar2[iVal._4_4_] == ' '; iVal._4_4_ = iVal._4_4_ + 1) {
    }
    local_40 = 0;
    if (puVar2[iVal._4_4_] == '-') {
      iVal._4_4_ = iVal._4_4_ + 1;
      iVal._0_4_ = -1;
    }
    while( true ) {
      bVar1 = false;
      if (0x2f < puVar2[iVal._4_4_]) {
        bVar1 = puVar2[iVal._4_4_] < 0x3a;
      }
      if (!bVar1) break;
      local_40 = local_40 * 10 + (long)(int)(puVar2[iVal._4_4_] - 0x30);
      iVal._4_4_ = iVal._4_4_ + 1;
    }
    *pnByte = local_40 * (int)iVal;
  }
  return;
}

Assistant:

static void fts3ReadEndBlockField(
  sqlite3_stmt *pStmt, 
  int iCol, 
  i64 *piEndBlock,
  i64 *pnByte
){
  const unsigned char *zText = sqlite3_column_text(pStmt, iCol);
  if( zText ){
    int i;
    int iMul = 1;
    i64 iVal = 0;
    for(i=0; zText[i]>='0' && zText[i]<='9'; i++){
      iVal = iVal*10 + (zText[i] - '0');
    }
    *piEndBlock = iVal;
    while( zText[i]==' ' ) i++;
    iVal = 0;
    if( zText[i]=='-' ){
      i++;
      iMul = -1;
    }
    for(/* no-op */; zText[i]>='0' && zText[i]<='9'; i++){
      iVal = iVal*10 + (zText[i] - '0');
    }
    *pnByte = (iVal * (i64)iMul);
  }
}